

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processDisconnectCommand(CommonCore *this,ActionMessage *cmd)

{
  BrokerBase *this_00;
  value_t vVar1;
  BrokerState BVar2;
  action_t aVar3;
  GlobalFederateId federateID;
  pointer pcVar4;
  size_type sVar5;
  FederateState *this_01;
  pthread_t pVar6;
  FilterFederate *this_02;
  TranslatorFederate *this_03;
  BaseTimeCoordinator *pBVar7;
  json_value jVar8;
  string_view message;
  string_view message_00;
  FedInfo *pFVar9;
  OperatingState OVar10;
  bool bVar11;
  FederateStates FVar12;
  pthread_t pVar13;
  string_view *psVar14;
  string *val;
  reference pvVar15;
  char *pcVar16;
  string_view queryStr;
  string_view queryStr_00;
  initializer_list_t init;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  string_view name;
  string_view name_00;
  string_view queryStr_01;
  string_view name_01;
  json base;
  const_iterator __end4;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  data local_148;
  data local_138;
  data local_128;
  const_iterator __begin4;
  json element;
  string_view local_50;
  string_view local_40;
  
  aVar3 = cmd->messageAction;
  switch(aVar3) {
  case cmd_user_disconnect:
switchD_00251be7_caseD_2:
    BVar2 = (this->super_BrokerBase).brokerState._M_i;
    if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) {
      if (BVar2 < TERMINATING) {
        BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
LAB_00251d1d:
        sendDisconnect(this,cmd_stop);
      }
    }
    else if (BVar2 == ERRORED) goto LAB_00251d1d;
    ActionMessage::ActionMessage((ActionMessage *)&fed,cmd_stop);
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)&fed);
    goto LAB_002524e0;
  case cmd_disconnect:
  case cmd_disconnect_fed:
    if ((cmd->dest_id).gid != 0) {
      routeMessage(this,cmd);
      return;
    }
    if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      find(&fed,&this->loopFederates,&cmd->source_id);
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      end(&__begin4,&(this->loopFederates).dataStorage);
      bVar11 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator==
                         ((BlockIterator<helics::FedInfo,32,helics::FedInfo**> *)&fed,&__begin4);
      if (!bVar11) {
        (fed.ptr)->state = DISCONNECTED;
        BVar2 = (this->super_BrokerBase).brokerState._M_i;
        bVar11 = checkAndProcessDisconnect(this);
        if (BVar2 < OPERATING || !bVar11) {
          ActionMessage::setAction(cmd,cmd_disconnect_fed);
          (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
          OVar10 = minFederateState(this);
          if ((((OVar10 != DISCONNECTED) || (this->filterFed != (FilterFederate *)0x0)) ||
              (this->translatorFed != (TranslatorFederate *)0x0)) &&
             ((this->super_BrokerBase).globalDisconnect == false)) {
            ActionMessage::setAction(cmd,cmd_disconnect_fed_ack);
            (cmd->dest_id).gid = (cmd->source_id).gid;
            (cmd->source_id).gid = 0;
            routeMessage(this,cmd);
          }
        }
      }
    }
    break;
  case cmd_disconnect_name:
    break;
  case cmd_disconnect_check:
    checkAndProcessDisconnect(this);
    return;
  case cmd_broadcast_disconnect:
    pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar7->_vptr_BaseTimeCoordinator[3])(pBVar7,cmd);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
    begin((iterator *)&__begin4,&(this->loopFederates).dataStorage);
    gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              ((iterator *)&__end4,&(this->loopFederates).dataStorage);
    fed.vec = __begin4.vec;
    fed.ptr = __begin4.ptr;
    fed._16_8_ = ZEXT48((uint)__begin4.offset);
    while ((fed.offset != __end4.offset || (fed.vec != __end4.vec))) {
      FederateState::addAction((fed.ptr)->fed,cmd);
      gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++(&fed);
    }
    checkAndProcessDisconnect(this);
    break;
  default:
    if (aVar3 == cmd_stop) {
      if (((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) &&
         ((this->super_BrokerBase).brokerState._M_i < TERMINATING)) {
        BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
        sendDisconnect(this,cmd_stop);
      }
      pVar6 = (this->filterThread)._M_i._M_thread;
      pVar13 = pthread_self();
      if ((pVar6 == pVar13) && (this_02 = this->filterFed, this_02 != (FilterFederate *)0x0)) {
        FilterFederate::~FilterFederate(this_02);
        operator_delete(this_02,0x4c0);
        this->filterFed = (FilterFederate *)0x0;
        LOCK();
        (this->filterThread)._M_i._M_thread = 0;
        UNLOCK();
      }
      if (((this->translatorThread)._M_i._M_thread == pVar13) &&
         (this_03 = this->translatorFed, this_03 != (TranslatorFederate *)0x0)) {
        TranslatorFederate::~TranslatorFederate(this_03);
        operator_delete(this_03,0x3d8);
        this->translatorFed = (TranslatorFederate *)0x0;
        LOCK();
        (this->translatorThread)._M_i._M_thread = 0;
        UNLOCK();
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fed,"#disconnected",(allocator<char> *)&__begin4);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::fulfillAllPromises
                (&this->activeQueries,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fed);
      std::__cxx11::string::~string((string *)&fed);
      return;
    }
    if (aVar3 == cmd_disconnect_core_ack) {
      if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        return;
      }
      if ((cmd->source_id).gid != (this->super_BrokerBase).higher_broker_id.gid) {
        return;
      }
      ActionMessage::ActionMessage((ActionMessage *)&fed,cmd_disconnect_fed_ack);
      fed.ptr = (FedInfo *)((ulong)fed.ptr & 0xffffffff00000000);
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      begin(&__begin4,&(this->loopFederates).dataStorage);
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      end(&__end4,&(this->loopFederates).dataStorage);
      while ((__begin4.offset != __end4.offset || (__begin4.vec != __end4.vec))) {
        this_01 = (__begin4.ptr)->fed;
        FVar12 = FederateState::getState(this_01);
        if (FVar12 != FINISHED) {
          fed.offset = (this_01->global_id)._M_i.gid;
          FederateState::addAction(this_01,(ActionMessage *)&fed);
        }
        gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
        operator++(&__begin4);
      }
      ActionMessage::ActionMessage((ActionMessage *)&__begin4,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)&__begin4);
      ActionMessage::~ActionMessage((ActionMessage *)&__begin4);
    }
    else {
      if (aVar3 != cmd_timeout_disconnect) {
        if (aVar3 != cmd_global_disconnect) {
          return;
        }
        goto switchD_00251be7_caseD_2;
      }
      if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) {
        this_00 = &this->super_BrokerBase;
        federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar5 = (this->super_BrokerBase).identifier._M_string_length;
        if ((cmd->source_id).gid == federateID.gid) {
          psVar14 = &local_50;
          local_50._M_len = 0x12;
          pcVar16 = "timeout disconnect";
        }
        else {
          psVar14 = &local_40;
          local_40._M_len = 0x1b;
          pcVar16 = "received timeout disconnect";
        }
        psVar14->_M_str = pcVar16;
        name_00._M_str = pcVar4;
        name_00._M_len = sVar5;
        BrokerBase::sendToLogger(this_00,federateID,0,name_00,*psVar14,false);
        pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        if ((pBVar7 != (BaseTimeCoordinator *)0x0) &&
           (*(pointer *)
             &(pBVar7->dependencies).dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
            (pBVar7->dependencies).dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&base,(nullptr_t)0x0);
          BrokerBase::addBaseInformation(this_00,&base,true);
          val = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&base,"state");
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_128.m_type;
          jVar8 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_128.m_value;
          local_128.m_type = vVar1;
          local_128.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_128);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_138,(nullptr_t)0x0);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&base,"time");
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_138.m_type;
          jVar8 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_138.m_value;
          local_138.m_type = vVar1;
          local_138.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_138);
          pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)&base,"time");
          (*pBVar7->_vptr_BaseTimeCoordinator[0xc])(pBVar7);
          init._M_len = 0;
          init._M_array = (iterator)&local_148;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init);
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&base,"federates");
          vVar1 = (pvVar15->m_data).m_type;
          (pvVar15->m_data).m_type = local_148.m_type;
          jVar8 = (pvVar15->m_data).m_value;
          (pvVar15->m_data).m_value = local_148.m_value;
          local_148.m_type = vVar1;
          local_148.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_148);
          gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
          ::begin(&__begin4,&(this->loopFederates).dataStorage);
          gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
          ::end(&__end4,&(this->loopFederates).dataStorage);
          while ((pFVar9 = __begin4.ptr, __begin4.offset != __end4.offset ||
                 (__begin4.vec != __end4.vec))) {
            queryStr_01._M_str = "global_time_debugging";
            queryStr_01._M_len = 0x15;
            federateQuery_abi_cxx11_((string *)&fed,this,(__begin4.ptr)->fed,queryStr_01,false);
            bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&fed,"#wait");
            if (bVar11) {
              FVar12 = FederateState::getState(pFVar9->fed);
              if (FVar12 < TERMINATING) {
                (cmd->dest_id).gid = (pFVar9->fed->global_id)._M_i.gid;
                (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
                FederateState::addAction(pFVar9->fed,cmd);
              }
            }
            else {
              jsonString._M_str = (char *)fed.ptr;
              jsonString._M_len = (size_t)&element.m_data;
              fileops::loadJsonStr_abi_cxx11_(jsonString);
              pvVar15 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)&base,"federates");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&element.m_data);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&element.m_data);
            }
            std::__cxx11::string::~string((string *)&fed);
            gmlc::containers::
            BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator++
                      (&__begin4);
          }
          if (this->filterFed != (FilterFederate *)0x0) {
            queryStr._M_str = "global_time_debugging";
            queryStr._M_len = 0x15;
            FilterFederate::query_abi_cxx11_((string *)&fed,this->filterFed,queryStr);
            jsonString_00._M_str = (char *)fed.ptr;
            jsonString_00._M_len = (size_t)&__begin4;
            fileops::loadJsonStr_abi_cxx11_(jsonString_00);
            pvVar15 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&base,"federates");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&__begin4);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&__begin4);
            std::__cxx11::string::~string((string *)&fed);
          }
          if (this->translatorFed != (TranslatorFederate *)0x0) {
            queryStr_00._M_str = "global_time_debugging";
            queryStr_00._M_len = 0x15;
            TranslatorFederate::query_abi_cxx11_((string *)&fed,this->translatorFed,queryStr_00);
            jsonString_01._M_str = (char *)fed.ptr;
            jsonString_01._M_len = (size_t)&__begin4;
            fileops::loadJsonStr_abi_cxx11_(jsonString_01);
            pvVar15 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)&base,"federates");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&__begin4);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&__begin4);
            std::__cxx11::string::~string((string *)&fed);
          }
          fileops::generateJsonString((string *)&fed,&base,true);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fed,0,
                 "TIME DEBUGGING::");
          message_00._M_str = (char *)fed.vec;
          message_00._M_len = (size_t)fed.ptr;
          name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
          BrokerBase::sendToLogger
                    (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3
                     ,name_01,message_00,false);
          std::__cxx11::string::~string((string *)&fed);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&base.m_data);
        }
        if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
          BrokerBase::setBrokerState(this_00,TERMINATING);
          (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          broadcastToFederates(this,cmd);
LAB_002524b6:
          sendDisconnect(this,cmd_stop);
        }
      }
      else if ((this->super_BrokerBase).brokerState._M_i == ERRORED) {
        message._M_str = "received timeout disconnect in error state";
        message._M_len = 0x2a;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,name,
                   message,false);
        goto LAB_002524b6;
      }
      ActionMessage::ActionMessage((ActionMessage *)&fed,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)&fed);
    }
LAB_002524e0:
    ActionMessage::~ActionMessage((ActionMessage *)&fed);
  }
  return;
}

Assistant:

void CommonCore::processDisconnectCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_USER_DISCONNECT:
        case CMD_GLOBAL_DISCONNECT:
            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            } else if (getBrokerState() ==
                       BrokerState::ERRORED) {  // we are disconnecting in an error state
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            // we can't just fall through since this may have generated other messages that need to
            // be forwarded or processed
            break;
        case CMD_BROADCAST_DISCONNECT:
            timeCoord->processTimeMessage(cmd);
            loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
            checkAndProcessDisconnect();
            break;
        case CMD_TIMEOUT_DISCONNECT:
            if (isConnected()) {
                if (cmd.source_id != global_broker_id_local) {
                    LOG_ERROR(global_broker_id_local,
                              getIdentifier(),
                              "received timeout disconnect");
                } else {
                    LOG_ERROR(global_broker_id_local, getIdentifier(), "timeout disconnect");
                }
                if (timeCoord && !timeCoord->empty()) {
                    nlohmann::json base;
                    addBaseInformation(base, true);
                    base["state"] = brokerStateName(getBrokerState());
                    base["time"] = nlohmann::json();
                    timeCoord->generateDebuggingTimeInfo(base["time"]);
                    base["federates"] = nlohmann::json::array();
                    for (const auto& fed : loopFederates) {
                        const std::string ret =
                            federateQuery(fed.fed, "global_time_debugging", false);
                        if (ret == "#wait") {
                            if (fed->getState() <= FederateStates::EXECUTING) {
                                cmd.dest_id = fed->global_id.load();
                                cmd.source_id = global_broker_id_local;
                                fed.fed->addAction(cmd);
                            }
                        } else {
                            auto element = fileops::loadJsonStr(ret);
                            base["federates"].push_back(element);
                        }
                    }
                    if (filterFed != nullptr) {
                        auto str = filterFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    if (translatorFed != nullptr) {
                        auto str = translatorFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    auto debugString = fileops::generateJsonString(base);
                    debugString.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(global_broker_id_local, identifier, debugString);
                }

                if (getBrokerState() < BrokerState::TERMINATING) {
                    // only send a disconnect message
                    // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    cmd.source_id = global_broker_id_local;
                    broadcastToFederates(cmd);
                    sendDisconnect();
                }
            } else if (getBrokerState() == BrokerState::ERRORED) {
                // we are disconnecting in an error state
                LOG_ERROR(global_broker_id_local,
                          getIdentifier(),
                          "received timeout disconnect in error state");
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            break;
        case CMD_STOP:

            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            }
            if (filterThread.load() == std::this_thread::get_id()) {
                if (filterFed != nullptr) {
                    delete filterFed;
                    filterFed = nullptr;
                    filterThread.store(std::thread::id{});
                }
            }
            if (translatorThread.load() == std::this_thread::get_id()) {
                if (translatorFed != nullptr) {
                    delete translatorFed;
                    translatorFed = nullptr;
                    translatorThread.store(std::thread::id{});
                }
            }
            activeQueries.fulfillAllPromises("#disconnected");
            break;
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_FED:
            if (cmd.dest_id == parent_broker_id) {
                if (getBrokerState() < BrokerState::TERMINATING) {
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed == loopFederates.end()) {
                        return;
                    }
                    fed->state = OperatingState::DISCONNECTED;
                    auto cstate = getBrokerState();
                    if ((!checkAndProcessDisconnect()) || (cstate < BrokerState::OPERATING)) {
                        cmd.setAction(CMD_DISCONNECT_FED);
                        transmit(parent_route_id, cmd);
                        if ((minFederateState() != OperatingState::DISCONNECTED ||
                             filterFed != nullptr || translatorFed != nullptr) &&
                            !globalDisconnect) {
                            cmd.setAction(CMD_DISCONNECT_FED_ACK);
                            cmd.dest_id = cmd.source_id;
                            cmd.source_id = parent_broker_id;
                            routeMessage(cmd);
                        }
                    }
                }
            } else {
                routeMessage(cmd);
            }

            break;
        case CMD_DISCONNECT_CHECK:
            checkAndProcessDisconnect();
            break;
        case CMD_DISCONNECT_CORE_ACK:
            if ((cmd.dest_id == global_broker_id_local) && (cmd.source_id == higher_broker_id)) {
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                for (auto fed : loopFederates) {
                    if (fed->getState() != FederateStates::FINISHED) {
                        bye.dest_id = fed->global_id.load();
                        fed->addAction(bye);
                    }
                }
                addActionMessage(CMD_STOP);
            }
            break;
        default:
            break;
    }
}